

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O2

char * aom_codec_err_to_string(aom_codec_err_t err)

{
  if (err < (AOM_CODEC_INVALID_PARAM|AOM_CODEC_MEM_ERROR)) {
    return &DAT_00431c8c + *(int *)(&DAT_00431c8c + (ulong)err * 4);
  }
  return "Unrecognized error code";
}

Assistant:

const char *aom_codec_err_to_string(aom_codec_err_t err) {
  switch (err) {
    case AOM_CODEC_OK: return "Success";
    case AOM_CODEC_ERROR: return "Unspecified internal error";
    case AOM_CODEC_MEM_ERROR: return "Memory allocation error";
    case AOM_CODEC_ABI_MISMATCH: return "ABI version mismatch";
    case AOM_CODEC_INCAPABLE:
      return "Codec does not implement requested capability";
    case AOM_CODEC_UNSUP_BITSTREAM:
      return "Bitstream not supported by this decoder";
    case AOM_CODEC_UNSUP_FEATURE:
      return "Bitstream required feature not supported by this decoder";
    case AOM_CODEC_CORRUPT_FRAME: return "Corrupt frame detected";
    case AOM_CODEC_INVALID_PARAM: return "Invalid parameter";
    case AOM_CODEC_LIST_END: return "End of iterated list";
  }

  return "Unrecognized error code";
}